

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  void *pvVar1;
  long *plVar2;
  FailureReporterInterface *pFVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Expectation EVar4;
  long *local_30 [2];
  long local_20 [2];
  
  plVar2 = *(long **)((long)&(exp->source_text_).field_2 + 8);
  do {
    if (plVar2 == (long *)(exp->description_)._M_dataplus._M_p) {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,"Cannot find expectation.","");
      pFVar3 = GetFailureReporter();
      (*pFVar3->_vptr_FailureReporterInterface[2])
                (pFVar3,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O3/googletest-src/googlemock/src/gmock-spec-builders.cc"
                 ,0x182,local_30);
      in_RDX._M_pi = extraout_RDX;
      if (local_30[0] != local_20) {
        operator_delete(local_30[0],local_20[0] + 1);
        in_RDX._M_pi = extraout_RDX_00;
      }
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
      this->mock_obj_ = (void *)0x0;
LAB_0018a71e:
      EVar4.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = in_RDX._M_pi;
      EVar4.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Expectation)
             EVar4.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar2 == in_RDX._M_pi) {
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)*plVar2;
      pvVar1 = (void *)plVar2[1];
      this->mock_obj_ = pvVar1;
      if (pvVar1 != (void *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + 1;
        }
      }
      goto LAB_0018a71e;
    }
    plVar2 = plVar2 + 2;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it = untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}